

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O0

void recff_nyi(jit_State *J,RecordFFData *rd)

{
  jit_State *in_RSI;
  long in_RDI;
  BCOp op;
  jit_State *in_stack_00000020;
  uint in_stack_ffffffffffffffe8;
  TraceLink in_stack_ffffffffffffffec;
  
  if (*(int *)(in_RDI + 0x658) + 0x8000U <= *(uint *)(in_RDI + 8)) {
    if ((((((*(int *)(in_RDI + 0xe4) == 0) ||
           ((*(uint *)(*(long *)(*(long *)(in_RDI + 0x68) + 0x10) + -4) & 3) != 0)) ||
          (in_stack_ffffffffffffffec =
                *(TraceLink *)(ulong)*(uint *)(*(long *)(*(long *)(in_RDI + 0x68) + 0x10) + -4) &
                0xff, in_stack_ffffffffffffffec == 0x41)) ||
         ((in_stack_ffffffffffffffec == 0x43 || (in_stack_ffffffffffffffec == 0x49)))) ||
        ((in_stack_ffffffffffffffec == 0x3f ||
         ((in_stack_ffffffffffffffe8 = (uint)*(byte *)(*(long *)(in_RDI + 0x78) + 6),
          in_stack_ffffffffffffffe8 == 0x13 || (in_stack_ffffffffffffffe8 == 0x8b)))))) ||
       (in_stack_ffffffffffffffe8 == 0x91)) {
      lj_record_stop(in_RSI,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8);
      (in_RSI->cur).nins = 0xffffffff;
      (in_RSI->cur).gclist = 0xffffffff;
    }
    else {
      recff_stitch(in_stack_00000020);
      (in_RSI->cur).nins = 0xffffffff;
      (in_RSI->cur).gclist = 0xffffffff;
    }
    return;
  }
  lj_trace_err_info(in_RSI,in_stack_ffffffffffffffec);
}

Assistant:

static void LJ_FASTCALL recff_nyi(jit_State *J, RecordFFData *rd)
{
  if (J->cur.nins < (IRRef)J->param[JIT_P_minstitch] + REF_BASE) {
    lj_trace_err_info(J, LJ_TRERR_TRACEUV);
  } else {
    /* Can only stitch from Lua call. */
    if (J->framedepth && frame_islua(J->L->base-1)) {
      BCOp op = bc_op(*frame_pc(J->L->base-1));
      /* Stitched trace cannot start with *M op with variable # of args. */
      if (!(op == BC_CALLM || op == BC_CALLMT ||
	    op == BC_RETM || op == BC_TSETM)) {
	switch (J->fn->c.ffid) {
	case FF_error:
	case FF_debug_sethook:
	case FF_jit_flush:
	  break;  /* Don't stitch across special builtins. */
	default:
	  recff_stitch(J);  /* Use trace stitching. */
	  rd->nres = -1;
	  return;
	}
      }
    }
    /* Otherwise stop trace and return to interpreter. */
    lj_record_stop(J, LJ_TRLINK_RETURN, 0);
    rd->nres = -1;
  }
}